

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

tuple<double,_baryonyx::show_size_type>
baryonyx::memory_consumed_size<unsigned_long>(unsigned_long size)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  uint *in_RDI;
  double dVar6;
  _Head_base<0UL,_double,_false> _Var7;
  undefined1 in_ZMM0 [64];
  tuple<double,_baryonyx::show_size_type> tVar8;
  
  auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,size);
  _Var7._M_head_impl = auVar3._0_8_;
  uVar5 = 0;
  dVar1 = _Var7._M_head_impl * 0.0009765625;
  dVar2 = dVar1 * 0.0009765625;
  dVar6 = dVar2 * 0.0009765625;
  if (dVar2 * 0.0009765625 <= 0.5) {
    if (dVar2 <= 0.5) {
      bVar4 = 0.5 < dVar1;
      uVar5 = bVar4 ^ 3;
      dVar6 = (double)((ulong)bVar4 * (long)dVar1 + (ulong)!bVar4 * (long)_Var7._M_head_impl);
      _Var7._M_head_impl = dVar6;
    }
    else {
      uVar5 = 1;
      dVar6 = dVar2;
    }
  }
  *in_RDI = uVar5;
  *(double *)(in_RDI + 2) = dVar6;
  tVar8.super__Tuple_impl<0UL,_double,_baryonyx::show_size_type>.
  super__Head_base<0UL,_double,_false>._M_head_impl = _Var7._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_double,_baryonyx::show_size_type>._0_8_ = in_RDI;
  return (tuple<double,_baryonyx::show_size_type>)
         tVar8.super__Tuple_impl<0UL,_double,_baryonyx::show_size_type>;
}

Assistant:

inline std::tuple<double, show_size_type>
memory_consumed_size(T size) noexcept
{
    static_assert(
      (std::is_integral<T>::value || std::is_floating_point<T>::value),
      "Integer or real required.");

    const auto kb = static_cast<double>(size) / 1024.;
    const auto mb = kb / 1024.;
    const auto gb = mb / 1024.;

    if (gb > 0.5)
        return { gb, show_size_type::GB };

    if (mb > 0.5)
        return { mb, show_size_type::MB };

    if (kb > 0.5)
        return { kb, show_size_type::KB };

    return { static_cast<double>(size), show_size_type::B };
}